

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundingbox.h
# Opt level: O0

bool __thiscall BoundingBox::intersect(BoundingBox *this,Ray *r,float tmin,float tmax)

{
  float fVar1;
  float *pfVar2;
  Vector3f *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  Vector3f s_2;
  Vector3f s_1;
  Vector3f s;
  float t;
  float eps;
  Vector3f d;
  Vector3f o;
  Vector3f *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  float fVar3;
  undefined4 in_stack_fffffffffffffef4;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff0c;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  Vector3f local_7c [2];
  Vector3f local_64 [2];
  Vector3f local_4c;
  float local_40;
  undefined4 local_3c;
  Vector3f local_38;
  Vector3f local_2c;
  float local_20;
  float local_1c;
  
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  Vector3f::Vector3f((Vector3f *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8);
  Vector3f::Vector3f((Vector3f *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8);
  local_3c = 0x3c23d70a;
  pfVar2 = Vector3f::operator[](in_RDI,0);
  fVar3 = *pfVar2;
  pfVar2 = Vector3f::operator[](&local_2c,0);
  if (fVar3 - 0.01 <= *pfVar2) {
    pfVar2 = Vector3f::operator[](&local_2c,0);
    fVar3 = *pfVar2;
    pfVar2 = Vector3f::operator[](in_RDI + 1,0);
    if (fVar3 <= *pfVar2 + 0.01) {
      pfVar2 = Vector3f::operator[](in_RDI,1);
      fVar3 = *pfVar2;
      pfVar2 = Vector3f::operator[](&local_2c,1);
      if (fVar3 - 0.01 <= *pfVar2) {
        pfVar2 = Vector3f::operator[](&local_2c,1);
        fVar3 = *pfVar2;
        pfVar2 = Vector3f::operator[](in_RDI + 1,1);
        if (fVar3 <= *pfVar2 + 0.01) {
          pfVar2 = Vector3f::operator[](in_RDI,2);
          fVar3 = *pfVar2;
          pfVar2 = Vector3f::operator[](&local_2c,2);
          if (fVar3 - 0.01 <= *pfVar2) {
            pfVar2 = Vector3f::operator[](&local_2c,2);
            fVar3 = *pfVar2;
            pfVar2 = Vector3f::operator[](in_RDI + 1,2);
            if (fVar3 <= *pfVar2 + 0.01) {
              return true;
            }
          }
        }
      }
    }
  }
  pfVar2 = Vector3f::operator[](in_RDI,0);
  fVar3 = *pfVar2;
  pfVar2 = Vector3f::operator[](in_RDI + 1,0);
  if (fVar3 <= *pfVar2) {
    local_1c = local_1c - 0.01;
    local_20 = local_20 + 0.01;
    pfVar2 = Vector3f::operator[](&local_38,0);
    if ((*pfVar2 != 0.0) || (NAN(*pfVar2))) {
      pfVar2 = Vector3f::operator[](&local_38,0);
      if (*pfVar2 <= 0.0) {
        pfVar2 = Vector3f::operator[](in_RDI + 1,0);
        fVar3 = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_2c,0);
        fVar1 = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_38,0);
        local_40 = (fVar3 - fVar1) / *pfVar2;
      }
      else {
        pfVar2 = Vector3f::operator[](in_RDI,0);
        fVar3 = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_2c,0);
        fVar1 = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_38,0);
        local_40 = (fVar3 - fVar1) / *pfVar2;
      }
      if ((local_1c <= local_40) && (local_40 <= local_20)) {
        ::operator*(in_stack_ffffffffffffff0c,
                    (Vector3f *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        ::operator+((Vector3f *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                    (Vector3f *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        pfVar2 = Vector3f::operator[](in_RDI,1);
        fVar3 = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_4c,1);
        if (fVar3 - 0.01 <= *pfVar2) {
          pfVar2 = Vector3f::operator[](&local_4c,1);
          fVar3 = *pfVar2;
          pfVar2 = Vector3f::operator[](in_RDI + 1,1);
          if (fVar3 <= *pfVar2 + 0.01) {
            pfVar2 = Vector3f::operator[](in_RDI,2);
            fVar3 = *pfVar2;
            pfVar2 = Vector3f::operator[](&local_4c,2);
            if (fVar3 - 0.01 <= *pfVar2) {
              pfVar2 = Vector3f::operator[](&local_4c,2);
              fVar3 = *pfVar2;
              pfVar2 = Vector3f::operator[](in_RDI + 1,2);
              if (fVar3 <= *pfVar2 + 0.01) {
                return true;
              }
            }
          }
        }
      }
    }
    pfVar2 = Vector3f::operator[](&local_38,1);
    if ((*pfVar2 != 0.0) || (NAN(*pfVar2))) {
      pfVar2 = Vector3f::operator[](&local_38,1);
      if (*pfVar2 <= 0.0) {
        pfVar2 = Vector3f::operator[](in_RDI + 1,1);
        fVar3 = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_2c,1);
        fVar1 = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_38,1);
        local_40 = (fVar3 - fVar1) / *pfVar2;
      }
      else {
        pfVar2 = Vector3f::operator[](in_RDI,1);
        fVar3 = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_2c,1);
        fVar1 = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_38,1);
        local_40 = (fVar3 - fVar1) / *pfVar2;
      }
      if ((local_1c <= local_40) && (local_40 <= local_20)) {
        ::operator*(in_stack_ffffffffffffff0c,
                    (Vector3f *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        ::operator+((Vector3f *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                    (Vector3f *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        pfVar2 = Vector3f::operator[](in_RDI,0);
        in_stack_ffffffffffffff1c = *pfVar2 - 0.01;
        pfVar2 = Vector3f::operator[](local_64,0);
        if (in_stack_ffffffffffffff1c <= *pfVar2) {
          pfVar2 = Vector3f::operator[](local_64,0);
          in_stack_ffffffffffffff18 = *pfVar2;
          pfVar2 = Vector3f::operator[](in_RDI + 1,0);
          if (in_stack_ffffffffffffff18 <= *pfVar2 + 0.01) {
            pfVar2 = Vector3f::operator[](in_RDI,2);
            in_stack_ffffffffffffff14 = *pfVar2 - 0.01;
            pfVar2 = Vector3f::operator[](local_64,2);
            if (in_stack_ffffffffffffff14 <= *pfVar2) {
              pfVar2 = Vector3f::operator[](local_64,2);
              in_stack_ffffffffffffff10 = *pfVar2;
              pfVar2 = Vector3f::operator[](in_RDI + 1,2);
              if (in_stack_ffffffffffffff10 <= *pfVar2 + 0.01) {
                return true;
              }
            }
          }
        }
      }
    }
    pfVar2 = Vector3f::operator[](&local_38,2);
    if ((*pfVar2 != 0.0) || (NAN(*pfVar2))) {
      pfVar2 = Vector3f::operator[](&local_38,2);
      if (*pfVar2 <= 0.0) {
        pfVar2 = Vector3f::operator[](in_RDI + 1,2);
        in_stack_ffffffffffffff00 = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_2c,2);
        in_stack_ffffffffffffff04 = in_stack_ffffffffffffff00 - *pfVar2;
        pfVar2 = Vector3f::operator[](&local_38,2);
        local_40 = in_stack_ffffffffffffff04 / *pfVar2;
      }
      else {
        pfVar2 = Vector3f::operator[](in_RDI,2);
        in_stack_ffffffffffffff0c = *pfVar2;
        pfVar2 = Vector3f::operator[](&local_2c,2);
        in_stack_ffffffffffffff0c = in_stack_ffffffffffffff0c - *pfVar2;
        pfVar2 = Vector3f::operator[](&local_38,2);
        local_40 = in_stack_ffffffffffffff0c / *pfVar2;
      }
      if ((local_1c <= local_40) && (local_40 <= local_20)) {
        ::operator*(in_stack_ffffffffffffff0c,
                    (Vector3f *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        ::operator+((Vector3f *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                    (Vector3f *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        pfVar2 = Vector3f::operator[](in_RDI,1);
        fVar3 = *pfVar2;
        pfVar2 = Vector3f::operator[](local_7c,1);
        if (fVar3 - 0.01 <= *pfVar2) {
          pfVar2 = Vector3f::operator[](local_7c,1);
          fVar3 = *pfVar2;
          pfVar2 = Vector3f::operator[](in_RDI + 1,1);
          if (fVar3 <= *pfVar2 + 0.01) {
            pfVar2 = Vector3f::operator[](in_RDI,0);
            fVar3 = *pfVar2 - 0.01;
            pfVar2 = Vector3f::operator[](local_7c,0);
            if (fVar3 <= *pfVar2) {
              pfVar2 = Vector3f::operator[](local_7c,0);
              fVar3 = *pfVar2;
              pfVar2 = Vector3f::operator[](in_RDI + 1,0);
              if (fVar3 <= *pfVar2 + 0.01) {
                return true;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool intersect(const Ray& r, float tmin,float tmax) {
		Vector3f o = r.o, d = r.d;
		const float eps = 1e-2;
		if (a[0] - eps <= o[0] && o[0] <= b[0] + eps && a[1] - eps <= o[1] && o[1] <= b[1] + eps && a[2] - eps <= o[2] && o[2] <= b[2] + eps)
			return 1;
		if (a[0] > b[0]) return 0; //empty box
		float t;
		tmin -= eps; tmax += eps;
		if (d[0] != 0.f)
		{
			if (d[0] > 0.f) t = (a[0] - o[0]) / d[0];
			else t = (b[0] - o[0]) / d[0];
			if (t >= tmin && t <= tmax)
			{
				Vector3f s = o + t * d;
				if (a[1] - eps <= s[1] && s[1] <= b[1] + eps && a[2] - eps <= s[2] && s[2] <= b[2] + eps)
					return 1;
			}
		}
		if (d[1] != 0.f)
		{
			if (d[1] > 0.f) t = (a[1] - o[1]) / d[1];
			else t = (b[1] - o[1]) / d[1];
			if (t >= tmin && t <= tmax)
			{
				Vector3f s = o + t * d;
				if (a[0] - eps <= s[0] && s[0] <= b[0] + eps && a[2] - eps <= s[2] && s[2] <= b[2] + eps)
					return 1;
			}
		}
		if (d[2] != 0.f)
		{
			if (d[2] > 0.f) t = (a[2] - o[2]) / d[2];
			else t = (b[2] - o[2]) / d[2];
			if (t >= tmin && t <= tmax)
			{
				Vector3f s = o + t * d;
				if (a[1] - eps <= s[1] && s[1] <= b[1] + eps && a[0] - eps <= s[0] && s[0] <= b[0] + eps)
					return 1;
			}
		}
		return 0;
	}